

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-clientsocket.c
# Opt level: O1

int lsend(lua_State *L)

{
  int __errnum;
  lua_Integer lVar1;
  char *__buf;
  ssize_t sVar2;
  int *piVar3;
  char *pcVar4;
  uint uVar5;
  int iVar6;
  size_t sz;
  size_t local_38;
  
  local_38 = 0;
  lVar1 = luaL_checkinteger(L,1);
  __buf = luaL_checklstring(L,2,&local_38);
  uVar5 = (uint)local_38;
joined_r0x001226db:
  if ((int)uVar5 < 1) {
    return 0;
  }
  sVar2 = send((int)lVar1,__buf,(ulong)uVar5,0);
  iVar6 = (int)sVar2;
  if (iVar6 < 0) goto LAB_0012270d;
  goto LAB_001226fe;
LAB_0012270d:
  piVar3 = __errno_location();
  __errnum = *piVar3;
  if ((__errnum != 4) && (__errnum != 0xb)) {
    pcVar4 = strerror(__errnum);
    luaL_error(L,"socket error: %s",pcVar4);
LAB_001226fe:
    __buf = __buf + iVar6;
    uVar5 = uVar5 - iVar6;
  }
  goto joined_r0x001226db;
}

Assistant:

static int
lsend(lua_State *L) {
	size_t sz = 0;
	int fd = luaL_checkinteger(L,1);
	const char * msg = luaL_checklstring(L, 2, &sz);

	block_send(L, fd, msg, (int)sz);

	return 0;
}